

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseLast(ExtensionSet *this,int number)

{
  CppType CVar1;
  LogMessage *pLVar2;
  MessageLite *pMVar3;
  LogMessage local_78;
  Voidify local_62;
  byte local_61;
  LogMessage local_60;
  Voidify local_4d [20];
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  Extension *local_20;
  Extension *extension;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension._4_4_ = number;
  pEStack_10 = this;
  local_20 = FindOrNull(this,number);
  local_39 = 0;
  if (local_20 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x38f,"extension != nullptr");
    local_39 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  local_61 = 0;
  if (((local_20->is_repeated ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x390,"extension->is_repeated");
    local_61 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_4d,pLVar2);
  }
  if ((local_61 & 1) == 0) {
    CVar1 = anon_unknown_59::cpp_type(local_20->type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x391,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_62,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_78);
    }
    pMVar3 = RepeatedPtrField<google::protobuf::MessageLite>::ReleaseLast
                       ((RepeatedPtrField<google::protobuf::MessageLite> *)local_20->field_0);
    return pMVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

MessageLite* ExtensionSet::ReleaseLast(int number) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK(extension->is_repeated);
  ABSL_DCHECK(cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE);
  return extension->ptr.repeated_message_value->ReleaseLast();
}